

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOR<std::complex<double>_>::ThreadData::ComputedElementMatrix
          (ThreadData *this,int64_t iel,
          TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *ek,
          TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *ef)

{
  mapped_type *__p;
  key_type *in_RDX;
  map<int,_std::pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>_>_>_>
  *in_RSI;
  pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>
  *in_RDI;
  pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>
  el;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffa8;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *in_stack_ffffffffffffffc0;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> *in_stack_ffffffffffffffc8;
  TPZSemaphore *in_stack_ffffffffffffffd0;
  
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_RDI,in_stack_ffffffffffffffa8);
  std::
  pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>
  ::
  pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_&,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_&,_true>
            ((pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>
              *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  __p = std::
        map<int,_std::pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>_>_>_>
        ::operator[](in_RSI,in_RDX);
  std::
  pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>
  ::operator=(in_RDI,__p);
  TPZSemaphore::Post(in_stack_ffffffffffffffd0);
  std::
  pair<TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>,_TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>_>
  ::~pair(in_RDI);
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x1d792e1);
  return;
}

Assistant:

void 
TPZStructMatrixOR<TVar>::ThreadData::ComputedElementMatrix(int64_t iel, TPZAutoPointer<TPZElementMatrixT<TVar>> &ek, TPZAutoPointer<TPZElementMatrixT<TVar>> &ef) {
    std::scoped_lock lock(fMutexAccessElement);
    std::pair< TPZAutoPointer<TPZElementMatrixT<TVar>>, TPZAutoPointer<TPZElementMatrixT<TVar>> > el(ek, ef);
    fSubmitted[iel] = el;
    fAssembly.Post();
}